

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Partition::AddChildObject(Partition *this,InterchangeObject *Object)

{
  if (Object != (InterchangeObject *)0x0) {
    if ((Object->InstanceUID).super_Identifier<16U>.m_HasValue == false) {
      Kumu::GenRandomValue(&Object->InstanceUID);
    }
    PacketList::AddPacket((this->m_PacketList).m_p,Object);
    return;
  }
  __assert_fail("Object",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                300,"virtual void ASDCP::MXF::Partition::AddChildObject(InterchangeObject *)");
}

Assistant:

void
ASDCP::MXF::Partition::AddChildObject(InterchangeObject* Object)
{
  assert(Object);

  if ( ! Object->InstanceUID.HasValue() )
    GenRandomValue(Object->InstanceUID);

  m_PacketList->AddPacket(Object);
}